

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::LeftFunction::eval
          (LeftFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  bitwidth_t bVar2;
  Type *in_RDI;
  DimResult dim;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff0c;
  Type *this_00;
  SVInt *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2b;
  bitwidth_t in_stack_ffffffffffffff2c;
  undefined8 local_48;
  undefined1 local_38;
  undefined1 local_36;
  
  this_00 = in_RDI;
  ArrayQueryFunction::getDim
            ((ArrayQueryFunction *)param_4.endLoc,(EvalContext *)param_4.startLoc,(Args *)this);
  if ((local_38 & 1) == 0) {
    if ((local_36 & 1) == 0) {
      if (local_48 == 0) {
        SVInt::SVInt(in_stack_ffffffffffffff20,(bitwidth_t)((ulong)this_00 >> 0x20),(uint64_t)in_RDI
                     ,SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0));
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_RDI,
                   (SVInt *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        SVInt::~SVInt(in_stack_ffffffffffffff20);
      }
      else {
        bVar2 = Type::getBitWidth(this_00);
        bVar1 = Type::isSigned(in_RDI);
        uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff08);
        SVInt::SVInt(in_stack_ffffffffffffff20,(bitwidth_t)((ulong)this_00 >> 0x20),(uint64_t)in_RDI
                     ,SUB41(bVar2 >> 0x18,0));
        slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,(SVInt *)CONCAT44(bVar2,uVar3));
        SVInt::~SVInt(in_stack_ffffffffffffff20);
      }
    }
    else {
      SVInt::createFillX(in_stack_ffffffffffffff2c,(bool)in_stack_ffffffffffffff2b);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_RDI,
                 (SVInt *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      SVInt::~SVInt(in_stack_ffffffffffffff20);
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_RDI,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  ArrayQueryFunction::DimResult::~DimResult((DimResult *)0x96dab6);
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue LeftFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                 const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.indexType)
        return SVInt(dim.indexType->getBitWidth(), 0, dim.indexType->isSigned());

    return SVInt(32, uint64_t(dim.range.left), true);
}